

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O0

rt_expr<viennamath::rt_expression_interface<double>_> * __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
          (rt_expr<viennamath::rt_expression_interface<double>> *this,ct_constant<8L> *param_1)

{
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *this_00;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_28;
  rt_expression_interface<double> *local_20;
  ct_constant<8L> *local_18;
  ct_constant<8L> *param_1_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = param_1;
  param_1_local = (ct_constant<8L> *)this;
  this_00 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(this_00,8.0);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&local_28,(element_type *)this_00);
  local_20 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)this,
             (auto_ptr_ref<const_viennamath::rt_expression_interface<double>_>)local_20);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr(&local_28);
  return (rt_expr<viennamath::rt_expression_interface<double>_> *)this;
}

Assistant:

rt_expr & operator=(ct_constant<value> const & /*other*/)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type>(value));
        return *this;
      }